

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase739::run(TestCase739 *this)

{
  bool bVar1;
  size_t in_RCX;
  char *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int in_R8D;
  int __flags;
  char *pcVar2;
  int local_7b8;
  bool local_7b1;
  int local_7b0;
  DebugExpression<int> DStack_7ac;
  bool _kj_shouldLog_6;
  undefined1 local_7a8 [8];
  DebugComparison<int,_int_&> _kjCondition_6;
  int local_778;
  DebugExpression<int> DStack_774;
  bool _kj_shouldLog_5;
  undefined1 local_770 [8];
  DebugComparison<int,_int_&> _kjCondition_5;
  SourceLocation local_740;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_728;
  uint32_t local_6e4 [2];
  bool local_6da;
  undefined1 auStack_6d8 [6];
  bool _kj_shouldLog_4;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_6c0;
  uint32_t local_67c [2];
  DebugExpression<int> local_674;
  undefined1 local_670 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_4;
  SourceLocation local_648;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_630;
  uint32_t local_5ec [2];
  bool local_5e2;
  undefined1 auStack_5e0 [6];
  bool _kj_shouldLog_3;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_5c8;
  uint32_t local_584 [2];
  DebugExpression<int> local_57c;
  undefined1 local_578 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_3;
  SourceLocation local_550;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_538;
  uint32_t local_4f4 [2];
  bool local_4ea;
  undefined1 auStack_4e8 [6];
  bool _kj_shouldLog_2;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_4d0;
  uint32_t local_48c [2];
  DebugExpression<int> local_484;
  undefined1 local_480 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  Maybe<capnp::MessageSize> local_458;
  Client local_440;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_428;
  undefined1 local_3f0 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall2;
  Maybe<capnp::MessageSize> local_3b8;
  Client local_3a0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_388;
  undefined1 local_350 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall1;
  bool local_315;
  uint32_t local_314;
  int iStack_310;
  bool _kj_shouldLog_1;
  DebugExpression<int> local_30c;
  undefined1 local_308 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_1;
  bool local_2dd;
  uint32_t local_2dc;
  int iStack_2d8;
  bool _kj_shouldLog;
  DebugExpression<int> local_2d4;
  undefined1 local_2d0 [8];
  DebugComparison<int,_unsigned_int> _kjCondition;
  undefined1 local_2a8 [24];
  undefined1 local_290 [8];
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult> response;
  Maybe<capnp::MessageSize> local_248;
  Client local_230;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_218;
  undefined1 local_1e0 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall0;
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> promise;
  Maybe<capnp::MessageSize> local_178;
  undefined1 local_160 [8];
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  request;
  Client local_118;
  undefined1 local_100 [8];
  Client caller;
  undefined1 local_d8 [8];
  Client callee;
  int local_b8;
  int callerCallCount;
  int calleeCallCount;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase739 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  kj::WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  local_b8 = 0;
  callee._20_4_ = 0;
  kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&caller.field_0x10,&local_b8);
  capnproto_test::capnp::test::TestTailCallee::Client::Client<capnp::_::TestTailCalleeImpl,void>
            ((Client *)local_d8,
             (Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t> *)&caller.field_0x10);
  kj::Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t> *)&caller.field_0x10);
  kj::heap<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl,int&>
            ((kj *)&request.hook.ptr,(int *)&callee.field_0x14);
  DynamicCapability::Client::Client<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl,void>
            (&local_118,
             (Own<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl,_std::nullptr_t> *)
             &request.hook.ptr);
  Capability::Client::castAs<capnproto_test::capnp::test::TestTailCaller>
            ((Client *)local_100,&local_118.super_Client);
  DynamicCapability::Client::~Client(&local_118);
  kj::Own<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl,_std::nullptr_t> *)
             &request.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_178);
  capnproto_test::capnp::test::TestTailCaller::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_160,(Client *)local_100,&local_178);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_178);
  capnproto_test::capnp::test::TestTailCaller::FooParams::Builder::setI((Builder *)local_160,0x1c8);
  capnproto_test::capnp::test::TestTailCaller::FooParams::Builder::setCallee
            ((Builder *)local_160,(Client *)local_d8);
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::send((Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
          *)&dependentCall0.super_Pipeline._typeless.ops.disposer,(int)local_160,__buf,in_RCX,in_R8D
        );
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            (&local_230,(Pipeline *)&promise);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_248);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_218,&local_230,&local_248);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_1e0,(int)&local_218,__buf_00,in_RCX,in_R8D);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_218);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_248);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_230);
  pcVar2 = (char *)0x13;
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)local_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x2f7);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_> *)
             local_290,&dependentCall0.super_Pipeline._typeless.ops.disposer);
  iStack_2d8 = 0x1c8;
  local_2d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffd28);
  local_2dc = capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getI
                        ((Reader *)local_290);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_2d0,&local_2d4,&local_2dc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2d0);
  __n = (char *)local_2a8._16_8_;
  if (!bVar1) {
    local_2dd = kj::_::Debug::shouldLog(ERROR);
    __n = (char *)local_2a8._16_8_;
    while (local_2dd != false) {
      _kjCondition_1._28_4_ = 0x1c8;
      _kjCondition_1._24_4_ =
           capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getI
                     ((Reader *)local_290);
      __n = 
      "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()";
      pcVar2 = "failed: expected (456) == (response.getI())";
      kj::_::Debug::
      log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2f8,ERROR,
                 "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()"
                 ,(char (*) [44])"failed: expected (456) == (response.getI())",
                 (DebugComparison<int,_unsigned_int> *)local_2d0,(int *)&_kjCondition_1.field_0x1c,
                 (uint *)&_kjCondition_1.result);
      local_2dd = false;
    }
  }
  iStack_310 = 0x1c8;
  local_30c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffcf0);
  local_314 = capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getI
                        ((Reader *)local_290);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_308,&local_30c,&local_314);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_308);
  __flags = (int)pcVar2;
  if (!bVar1) {
    local_315 = kj::_::Debug::shouldLog(ERROR);
    while (__flags = (int)pcVar2, local_315 != false) {
      dependentCall1.super_Pipeline._typeless.ops.disposer._4_4_ = 0x1c8;
      dependentCall1.super_Pipeline._typeless.ops.disposer._0_4_ =
           capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getI
                     ((Reader *)local_290);
      __n = 
      "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()";
      pcVar2 = "failed: expected (456) == (response.getI())";
      kj::_::Debug::
      log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2f9,ERROR,
                 "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()"
                 ,(char (*) [44])"failed: expected (456) == (response.getI())",
                 (DebugComparison<int,_unsigned_int> *)local_308,
                 (int *)((long)&dependentCall1.super_Pipeline._typeless.ops.disposer + 4),
                 (uint *)&dependentCall1.super_Pipeline._typeless.ops.disposer);
      local_315 = false;
    }
  }
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            (&local_3a0,(Pipeline *)&promise);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_3b8);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_388,&local_3a0,&local_3b8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_350,(int)&local_388,__buf_01,(size_t)__n,__flags);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_388);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_3b8);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_3a0);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getC
            (&local_440,(Reader *)local_290);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_458);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_428,&local_440,&local_458);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_3f0,(int)&local_428,__buf_02,(size_t)__n,__flags);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_428);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_458);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_440);
  local_48c[1] = 0;
  local_484 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_48c + 1));
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)auStack_4e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x2ff,0x35);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_4d0,local_1e0);
  local_48c[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                           (&local_4d0.super_Reader);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_480,&local_484,local_48c);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_4d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_480);
  if (!bVar1) {
    local_4ea = kj::_::Debug::shouldLog(ERROR);
    while (local_4ea != false) {
      local_4f4[1] = 0;
      kj::SourceLocation::SourceLocation
                (&local_550,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,&DAT_009b6b8e,0x2ff,0x35);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_538,local_1e0);
      local_4f4[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_538.super_Reader);
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2ff,ERROR,
                 "\"failed: expected \" \"(0) == (dependentCall0.wait(waitScope).getN())\", _kjCondition, 0, dependentCall0.wait(waitScope).getN()"
                 ,(char (*) [64])"failed: expected (0) == (dependentCall0.wait(waitScope).getN())",
                 (DebugComparison<int,_unsigned_int> *)local_480,(int *)(local_4f4 + 1),local_4f4);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_538);
      local_4ea = false;
    }
  }
  local_584[1] = 1;
  local_57c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_584 + 1));
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)auStack_5e0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x300,0x35);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_5c8,local_350);
  local_584[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                           (&local_5c8.super_Reader);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_578,&local_57c,local_584);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_5c8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_578);
  if (!bVar1) {
    local_5e2 = kj::_::Debug::shouldLog(ERROR);
    while (local_5e2 != false) {
      local_5ec[1] = 1;
      kj::SourceLocation::SourceLocation
                (&local_648,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,&DAT_009b6b8e,0x300,0x35);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_630,local_350);
      local_5ec[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_630.super_Reader);
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x300,ERROR,
                 "\"failed: expected \" \"(1) == (dependentCall1.wait(waitScope).getN())\", _kjCondition, 1, dependentCall1.wait(waitScope).getN()"
                 ,(char (*) [64])"failed: expected (1) == (dependentCall1.wait(waitScope).getN())",
                 (DebugComparison<int,_unsigned_int> *)local_578,(int *)(local_5ec + 1),local_5ec);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_630);
      local_5e2 = false;
    }
  }
  local_67c[1] = 2;
  local_674 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_67c + 1));
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)auStack_6d8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,&DAT_009b6b8e,0x301,0x35);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_6c0,local_3f0);
  local_67c[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                           (&local_6c0.super_Reader);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_670,&local_674,local_67c);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_6c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_670);
  if (!bVar1) {
    local_6da = kj::_::Debug::shouldLog(ERROR);
    while (local_6da != false) {
      local_6e4[1] = 2;
      kj::SourceLocation::SourceLocation
                (&local_740,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,&DAT_009b6b8e,0x301,0x35);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_728,local_3f0);
      local_6e4[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_728.super_Reader);
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x301,ERROR,
                 "\"failed: expected \" \"(2) == (dependentCall2.wait(waitScope).getN())\", _kjCondition, 2, dependentCall2.wait(waitScope).getN()"
                 ,(char (*) [64])"failed: expected (2) == (dependentCall2.wait(waitScope).getN())",
                 (DebugComparison<int,_unsigned_int> *)local_670,(int *)(local_6e4 + 1),local_6e4);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_728);
      local_6da = false;
    }
  }
  local_778 = 1;
  DStack_774 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_778);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_770,&stack0xfffffffffffff88c,&local_b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_770);
  if (!bVar1) {
    _kjCondition_6._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._39_1_ != '\0') {
      _kjCondition_6.result = true;
      _kjCondition_6._33_3_ = 0;
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x303,ERROR,
                 "\"failed: expected \" \"(1) == (calleeCallCount)\", _kjCondition, 1, calleeCallCount"
                 ,(char (*) [42])"failed: expected (1) == (calleeCallCount)",
                 (DebugComparison<int,_int_&> *)local_770,(int *)&_kjCondition_6.result,&local_b8);
      _kjCondition_6._39_1_ = 0;
    }
  }
  local_7b0 = 1;
  DStack_7ac = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_7b0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_7a8,&stack0xfffffffffffff854,
             (int *)&callee.field_0x14);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7a8);
  if (!bVar1) {
    local_7b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7b1 != false) {
      local_7b8 = 1;
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x304,ERROR,
                 "\"failed: expected \" \"(1) == (callerCallCount)\", _kjCondition, 1, callerCallCount"
                 ,(char (*) [42])"failed: expected (1) == (callerCallCount)",
                 (DebugComparison<int,_int_&> *)local_7a8,&local_7b8,(int *)&callee.field_0x14);
      local_7b1 = false;
    }
  }
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_3f0);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_350);
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult>::~Response
            ((Response<capnproto_test::capnp::test::TestTailCallee::TailResult> *)local_290);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_1e0);
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> *)
             &dependentCall0.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::~Request((Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
              *)local_160);
  capnproto_test::capnp::test::TestTailCaller::Client::~Client((Client *)local_100);
  capnproto_test::capnp::test::TestTailCallee::Client::~Client((Client *)local_d8);
  kj::WaitScope::~WaitScope((WaitScope *)local_a8);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Capability, DynamicServerTailCall) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int calleeCallCount = 0;
  int callerCallCount = 0;

  test::TestTailCallee::Client callee(kj::heap<TestTailCalleeImpl>(calleeCallCount));
  test::TestTailCaller::Client caller =
      DynamicCapability::Client(kj::heap<TestTailCallerDynamicImpl>(callerCallCount))
          .castAs<test::TestTailCaller>();

  auto request = caller.fooRequest();
  request.setI(456);
  request.setCallee(callee);

  auto promise = request.send();

  auto dependentCall0 = promise.getC().getCallSequenceRequest().send();

  auto response = promise.wait(waitScope);
  EXPECT_EQ(456, response.getI());
  EXPECT_EQ(456, response.getI());

  auto dependentCall1 = promise.getC().getCallSequenceRequest().send();

  auto dependentCall2 = response.getC().getCallSequenceRequest().send();

  EXPECT_EQ(0, dependentCall0.wait(waitScope).getN());
  EXPECT_EQ(1, dependentCall1.wait(waitScope).getN());
  EXPECT_EQ(2, dependentCall2.wait(waitScope).getN());

  EXPECT_EQ(1, calleeCallCount);
  EXPECT_EQ(1, callerCallCount);
}